

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Path * __thiscall kj::Path::append(Path *__return_storage_ptr__,Path *this,PathPtr suffix)

{
  String *pSVar1;
  undefined8 *puVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  String *pSVar6;
  String *pSVar7;
  size_t sVar8;
  char *size;
  char *value;
  Array<kj::String> *__range1;
  long lVar9;
  String *pSVar10;
  String local_48;
  
  sVar8 = suffix.parts.size_;
  pSVar6 = (String *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x18,0,(this->parts).size_ + sVar8,(_func_void_void_ptr *)0x0,
                      (_func_void_void_ptr *)0x0);
  sVar3 = (this->parts).size_;
  pSVar10 = pSVar6;
  if (sVar3 != 0) {
    pSVar7 = (this->parts).ptr;
    pSVar1 = pSVar7 + sVar3;
    do {
      (pSVar10->content).ptr = (pSVar7->content).ptr;
      (pSVar10->content).size_ = (pSVar7->content).size_;
      (pSVar10->content).disposer = (pSVar7->content).disposer;
      (pSVar7->content).ptr = (char *)0x0;
      (pSVar7->content).size_ = 0;
      pSVar10 = pSVar10 + 1;
      pSVar7 = pSVar7 + 1;
    } while (pSVar7 != pSVar1);
  }
  if (sVar8 != 0) {
    lVar5 = 0;
    do {
      lVar9 = lVar5;
      pcVar4 = *(char **)((long)&((suffix.parts.ptr)->content).size_ + lVar9);
      value = pcVar4;
      if (pcVar4 != (char *)0x0) {
        value = *(char **)((long)&((suffix.parts.ptr)->content).ptr + lVar9);
      }
      size = (char *)0x0;
      if (pcVar4 != (char *)0x0) {
        size = pcVar4 + -1;
      }
      heapString(&local_48,value,(size_t)size);
      puVar2 = (undefined8 *)((long)&(pSVar10->content).ptr + lVar9);
      *puVar2 = local_48.content.ptr;
      puVar2[1] = local_48.content.size_;
      puVar2[2] = local_48.content.disposer;
      lVar5 = lVar9 + 0x18;
    } while (sVar8 * 0x18 != lVar9 + 0x18);
    pSVar10 = (String *)((long)&pSVar10[1].content.ptr + lVar9);
  }
  (__return_storage_ptr__->parts).ptr = pSVar6;
  (__return_storage_ptr__->parts).size_ = ((long)pSVar10 - (long)pSVar6 >> 3) * -0x5555555555555555;
  (__return_storage_ptr__->parts).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  return __return_storage_ptr__;
}

Assistant:

Path Path::append(PathPtr suffix) && {
  auto newParts = kj::heapArrayBuilder<String>(parts.size() + suffix.parts.size());
  for (auto& p: parts) newParts.add(kj::mv(p));
  for (auto& p: suffix.parts) newParts.add(heapString(p));
  return Path(newParts.finish(), ALREADY_CHECKED);
}